

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O2

void print_record(ares_dns_record_t *dnsrec)

{
  uchar *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ares_dns_rr_t *paVar13;
  size_t sVar14;
  char *__s;
  uchar *cookie;
  ares_dns_rec_type_t qtype;
  undefined4 local_34;
  
  if (global_config.opts.display_comments != ARES_FALSE) {
    uVar5 = ares_dns_record_get_opcode(dnsrec);
    uVar8 = ares_dns_opcode_tostr(uVar5);
    uVar5 = ares_dns_record_get_rcode(dnsrec);
    uVar9 = ares_dns_rcode_tostr(uVar5);
    uVar3 = ares_dns_record_get_id(dnsrec);
    printf(";; ->>HEADER<<- opcode: %s, status: %s, id: %u\n",uVar8,uVar9,(ulong)uVar3);
    printf(";; flags:");
    uVar3 = ares_dns_record_get_flags(dnsrec);
    if ((uVar3 & 1) != 0) {
      printf(" qr");
    }
    if ((uVar3 & 2) != 0) {
      printf(" aa");
    }
    if ((uVar3 & 4) != 0) {
      printf(" tc");
    }
    if ((uVar3 & 8) != 0) {
      printf(" rd");
    }
    if ((uVar3 & 0x10) != 0) {
      printf(" ra");
    }
    if ((uVar3 & 0x20) != 0) {
      printf(" ad");
    }
    if ((uVar3 & 0x40) != 0) {
      printf(" cd");
    }
    uVar10 = ares_dns_record_query_cnt(dnsrec);
    uVar11 = ares_dns_record_rr_cnt(dnsrec,1);
    uVar12 = ares_dns_record_rr_cnt(dnsrec,2);
    uVar6 = ares_dns_record_rr_cnt(dnsrec,3);
    printf("; QUERY: %u, ANSWER: %u, AUTHORITY: %u, ADDITIONAL: %u\n\n",uVar10 & 0xffffffff,
           uVar11 & 0xffffffff,uVar12 & 0xffffffff,(ulong)uVar6);
    paVar13 = has_opt(dnsrec,ARES_SECTION_ADDITIONAL);
    cookie = (uchar *)0x0;
    _qtype = 0;
    if (paVar13 != (ares_dns_rr_t *)0x0) {
      iVar7 = ares_dns_rr_get_opt_byid(paVar13,0x1009,10,&cookie,&qtype);
      if (iVar7 == 0) {
        cookie = (uchar *)0x0;
      }
      puts(";; OPT PSEUDOSECTION:");
      bVar2 = ares_dns_rr_get_u8(paVar13,0x1007);
      uVar3 = ares_dns_rr_get_u16(paVar13,0x1008);
      uVar4 = ares_dns_rr_get_u16(paVar13,0x1005);
      printf("; EDNS: version: %u, flags: %u; udp: %u\n",(ulong)bVar2,(ulong)uVar3,(ulong)uVar4);
      if (cookie != (uchar *)0x0) {
        printf("; COOKIE: ");
        print_opt_bin(cookie,_qtype);
        puts(" (good)");
      }
    }
  }
  if (global_config.opts.display_question != ARES_FALSE) {
    if (global_config.opts.display_comments != ARES_FALSE) {
      puts(";; QUESTION SECTION:");
    }
    uVar10 = 0;
    while( true ) {
      uVar11 = ares_dns_record_query_cnt(dnsrec);
      if (uVar11 <= uVar10) break;
      iVar7 = ares_dns_record_query_get(dnsrec,uVar10,&cookie,&qtype,&local_34);
      puVar1 = cookie;
      if ((iVar7 != 0) || (cookie == (uchar *)0x0)) goto LAB_001046cc;
      sVar14 = strlen((char *)cookie);
      printf(";%s.\t",puVar1);
      if (sVar14 + 1 < 0x18) {
        putchar(9);
        if (sVar14 + 1 < 0x10) {
          putchar(9);
        }
      }
      if (global_config.opts.display_class != ARES_FALSE) {
        uVar8 = ares_dns_class_tostr(local_34);
        printf("%s\t",uVar8);
      }
      __s = (char *)ares_dns_rec_type_tostr(_qtype & 0xffffffff);
      puts(__s);
      uVar10 = uVar10 + 1;
    }
    if (global_config.opts.display_comments != ARES_FALSE) {
      putchar(10);
    }
  }
LAB_001046cc:
  if (global_config.opts.display_answer != ARES_FALSE) {
    print_section(dnsrec,ARES_SECTION_ANSWER);
  }
  if (global_config.opts.display_additional != ARES_FALSE) {
    print_section(dnsrec,ARES_SECTION_ADDITIONAL);
  }
  if (global_config.opts.display_authority != ARES_FALSE) {
    print_section(dnsrec,ARES_SECTION_AUTHORITY);
  }
  if (global_config.opts.display_stats != ARES_FALSE) {
    cookie = (uchar *)0x0;
    _qtype = 0;
    ares_dns_write(dnsrec,&cookie,&qtype);
    printf(";; MSG SIZE  rcvd: %d\n\n",_qtype & 0xffffffff);
    ares_free_string(cookie);
  }
  return;
}

Assistant:

static void print_record(const ares_dns_record_t *dnsrec)
{
  if (global_config.opts.display_comments) {
    print_header(dnsrec);
    print_opt_psuedosection(dnsrec);
  }

  if (global_config.opts.display_question) {
    print_question(dnsrec);
  }

  if (global_config.opts.display_answer) {
    print_section(dnsrec, ARES_SECTION_ANSWER);
  }

  if (global_config.opts.display_additional) {
    print_section(dnsrec, ARES_SECTION_ADDITIONAL);
  }

  if (global_config.opts.display_authority) {
    print_section(dnsrec, ARES_SECTION_AUTHORITY);
  }

  if (global_config.opts.display_stats) {
    unsigned char *abuf = NULL;
    size_t         alen = 0;
    ares_dns_write(dnsrec, &abuf, &alen);
    printf(";; MSG SIZE  rcvd: %d\n\n", (int)alen);
    ares_free_string(abuf);
  }
}